

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

string * tyhp_time_gmt_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [32];
  char local_48 [8];
  char buf [16];
  tm *time_now;
  time_t now;
  string *str_time;
  
  std::__cxx11::string::string((string *)in_RDI);
  time((time_t *)&time_now);
  ptVar1 = localtime((time_t *)&time_now);
  switch(ptVar1->tm_wday) {
  case 0:
    std::__cxx11::string::operator+=((string *)in_RDI,"Sun, ");
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)in_RDI,"Mon, ");
    break;
  case 2:
    std::__cxx11::string::operator+=((string *)in_RDI,"Tue, ");
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)in_RDI,"Wed, ");
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)in_RDI,"Thu, ");
    break;
  case 5:
    std::__cxx11::string::operator+=((string *)in_RDI,"Fri, ");
    break;
  case 6:
    std::__cxx11::string::operator+=((string *)in_RDI,"Sat, ");
  }
  snprintf(local_48,0x10,"%d ",(ulong)(uint)ptVar1->tm_mday);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,local_48,&local_69);
  std::__cxx11::string::operator+=((string *)in_RDI,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  switch(ptVar1->tm_mon) {
  case 0:
    std::__cxx11::string::operator+=((string *)in_RDI,"Jan ");
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)in_RDI,"Feb ");
    break;
  case 2:
    std::__cxx11::string::operator+=((string *)in_RDI,"Mar ");
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)in_RDI,"Apr ");
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)in_RDI,"May ");
    break;
  case 5:
    std::__cxx11::string::operator+=((string *)in_RDI,"Jun ");
    break;
  case 6:
    std::__cxx11::string::operator+=((string *)in_RDI,"Jul ");
    break;
  case 7:
    std::__cxx11::string::operator+=((string *)in_RDI,"Aug ");
    break;
  case 8:
    std::__cxx11::string::operator+=((string *)in_RDI,"Sep ");
    break;
  case 9:
    std::__cxx11::string::operator+=((string *)in_RDI,"Oct ");
    break;
  case 10:
    std::__cxx11::string::operator+=((string *)in_RDI,"Nov ");
    break;
  case 0xb:
    std::__cxx11::string::operator+=((string *)in_RDI,"Dec ");
  }
  snprintf(local_48,0x10,"%d",(ulong)(ptVar1->tm_year + 0x76c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,local_48,&local_91);
  std::__cxx11::string::operator+=((string *)in_RDI,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  snprintf(local_48,0x10," %d:%d:%d ",(ulong)(uint)ptVar1->tm_hour,(ulong)(uint)ptVar1->tm_min,
           (ulong)(uint)ptVar1->tm_sec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,local_48,&local_b9);
  std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::operator+=((string *)in_RDI,"GMT");
  return in_RDI;
}

Assistant:

string tyhp_time_gmt()
{
	time_t now;
	struct tm *time_now;
	string str_time;

	time(&now);
	time_now = localtime(&now);

	switch(time_now->tm_wday)
	{
		case 0:
			str_time += "Sun, ";
			break;
		case 1:
			str_time += "Mon, ";
			break;
		case 2:
			str_time += "Tue, ";
			break;
		case 3:
			str_time += "Wed, ";
			break;
		case 4:
			str_time += "Thu, ";
			break;
		case 5:
			str_time += "Fri, ";
			break;
		case 6:
			str_time += "Sat, ";
			break;
	}
	char buf[16];
	snprintf(buf, sizeof(buf), "%d ", time_now->tm_mday);
	str_time += string(buf);
	switch(time_now->tm_mon)
	{
		case 0:
			str_time += "Jan ";
			break;
		case 1:
			str_time += "Feb ";
			break;
		case 2:
			str_time += "Mar ";
			break;
		case 3:
			str_time += "Apr ";
			break;
		case 4:
			str_time += "May ";
			break;
		case 5:
			str_time += "Jun ";
			break;
		case 6:
			str_time += "Jul ";
			break;
		case 7:
			str_time += "Aug ";
			break;
		case 8:
			str_time += "Sep ";
			break;
		case 9:
			str_time += "Oct ";
			break;
		case 10:
			str_time += "Nov ";
			break;
		case 11:
			str_time += "Dec ";
			break;
	}
	snprintf(buf, sizeof(buf), "%d", time_now->tm_year + 1900);
	str_time += string(buf);
	snprintf(buf, sizeof(buf), " %d:%d:%d ", time_now->tm_hour, time_now->tm_min, time_now->tm_sec);
	str_time += string(buf);

	str_time += "GMT";

	return str_time;
}